

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_userid_filter_module.c
# Opt level: O0

ngx_int_t ngx_http_userid_set_variable
                    (ngx_http_request_t *r,ngx_http_variable_value_t *v,uintptr_t data)

{
  ngx_http_userid_conf_t *conf_00;
  ngx_http_userid_ctx_t *ctx_00;
  ngx_int_t nVar1;
  ngx_http_userid_conf_t *conf;
  ngx_http_userid_ctx_t *ctx;
  uintptr_t data_local;
  ngx_http_variable_value_t *v_local;
  ngx_http_request_t *r_local;
  
  conf_00 = (ngx_http_userid_conf_t *)r->main->loc_conf[ngx_http_userid_filter_module.ctx_index];
  if (conf_00->enable < 2) {
    *(uint *)v = *(uint *)v & 0xbfffffff | 0x40000000;
    r_local = (ngx_http_request_t *)0x0;
  }
  else {
    ctx_00 = ngx_http_userid_get_uid(r->main,conf_00);
    if (ctx_00 == (ngx_http_userid_ctx_t *)0x0) {
      r_local = (ngx_http_request_t *)0xffffffffffffffff;
    }
    else {
      nVar1 = ngx_http_userid_create_uid(r->main,ctx_00,conf_00);
      if (nVar1 == 0) {
        if (ctx_00->uid_set[3] == 0) {
          *(uint *)v = *(uint *)v & 0xbfffffff | 0x40000000;
          r_local = (ngx_http_request_t *)0x0;
        }
        else {
          r_local = (ngx_http_request_t *)
                    ngx_http_userid_variable(r->main,v,&conf_00->name,ctx_00->uid_set);
        }
      }
      else {
        r_local = (ngx_http_request_t *)0xffffffffffffffff;
      }
    }
  }
  return (ngx_int_t)r_local;
}

Assistant:

static ngx_int_t
ngx_http_userid_set_variable(ngx_http_request_t *r,
    ngx_http_variable_value_t *v, uintptr_t data)
{
    ngx_http_userid_ctx_t   *ctx;
    ngx_http_userid_conf_t  *conf;

    conf = ngx_http_get_module_loc_conf(r->main, ngx_http_userid_filter_module);

    if (conf->enable < NGX_HTTP_USERID_V1) {
        v->not_found = 1;
        return NGX_OK;
    }

    ctx = ngx_http_userid_get_uid(r->main, conf);

    if (ctx == NULL) {
        return NGX_ERROR;
    }

    if (ngx_http_userid_create_uid(r->main, ctx, conf) != NGX_OK) {
        return NGX_ERROR;
    }

    if (ctx->uid_set[3] == 0) {
        v->not_found = 1;
        return NGX_OK;
    }

    return ngx_http_userid_variable(r->main, v, &conf->name, ctx->uid_set);
}